

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::EnumFieldGenerator::GenerateParsingCode
          (EnumFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  char *text;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "int rawValue = input.readEnum();\n$type$ value = $type$.valueOf(rawValue);\n")
  ;
  text = "if (value == null) {\n  unknownFields.mergeVarintField($number$, rawValue);\n} else {\n";
  if (*(int *)(*(long *)(*(long *)(*(long *)(this->descriptor_ + 0x38) + 0x10) + 0x88) + 0x50) == 3)
  {
    text = "if (value != null) {\n";
  }
  io::Printer::Print(printer,variables,text);
  io::Printer::Print(printer,variables,"  $set_has_field_bit_message$;\n  $name$_ = value;\n}\n");
  return;
}

Assistant:

void EnumFieldGenerator::
GenerateParsingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "int rawValue = input.readEnum();\n"
    "$type$ value = $type$.valueOf(rawValue);\n");
  if (HasUnknownFields(descriptor_->containing_type())) {
    printer->Print(variables_,
      "if (value == null) {\n"
      "  unknownFields.mergeVarintField($number$, rawValue);\n"
      "} else {\n");
  } else {
    printer->Print(variables_,
      "if (value != null) {\n");
  }
  printer->Print(variables_,
    "  $set_has_field_bit_message$;\n"
    "  $name$_ = value;\n"
    "}\n");
}